

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall ON_GeometryFingerprint::ON_GeometryFingerprint(ON_GeometryFingerprint *this)

{
  ON_WeightedAverageHash::ON_WeightedAverageHash(&this->m_pointWAH);
  ON_WeightedAverageHash::ON_WeightedAverageHash(&this->m_edgeWAH);
  Zero(this);
  return;
}

Assistant:

ON_GeometryFingerprint::ON_GeometryFingerprint()
{
  Zero();
}